

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_annotationbase.cpp
# Opt level: O1

void __thiscall
ON_Annotation::SetLengthFactor(ON_Annotation *this,ON_DimStyle *parent_style,double factor)

{
  ON_DimStyle *pOVar1;
  double dVar2;
  
  pOVar1 = ON_DimStyle::DimStyleOrDefault(parent_style);
  dVar2 = ON_DimStyle::LengthFactor(pOVar1);
  pOVar1 = Internal_GetOverrideStyle(this,factor * 2.220446049250313e-16 < ABS(factor - dVar2));
  if (pOVar1 != (ON_DimStyle *)0x0) {
    ON_DimStyle::SetLengthFactor(pOVar1,factor);
    ON_DimStyle::SetFieldOverride
              (pOVar1,LengthFactor,factor * 2.220446049250313e-16 < ABS(factor - dVar2));
    return;
  }
  return;
}

Assistant:

void ON_Annotation::SetLengthFactor(const ON_DimStyle* parent_style, double factor)
{
  parent_style = &ON_DimStyle::DimStyleOrDefault(parent_style);
  bool bCreate = Internal_DimStyleDoubleChanged(factor, parent_style->LengthFactor());
  ON_DimStyle* override_style = Internal_GetOverrideStyle(bCreate);
  if (nullptr != override_style)
  {
    override_style->SetLengthFactor(factor);
    override_style->SetFieldOverride(ON_DimStyle::field::LengthFactor, bCreate);
  }
}